

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml-parser.c
# Opt level: O3

coda_mem_record *
attribute_record_new
          (coda_type_record *definition,coda_xml_product *product,char *el,char **attr,
          int update_definition)

{
  coda_type *pcVar1;
  hashtable *table;
  uint8_t *data;
  coda_type_record_field **ppcVar2;
  int iVar3;
  coda_mem_record *type;
  char *pcVar4;
  long lVar5;
  coda_mem_data *field_type;
  char *name;
  size_t length;
  coda_type_text *pcVar6;
  long index;
  uint uVar7;
  ulong uVar8;
  char *real_name;
  char *local_38;
  
  if (definition->is_union != 0) {
    __assert_fail("!definition->is_union",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                  ,0x62,
                  "coda_mem_record *attribute_record_new(coda_type_record *, coda_xml_product *, const char *, const char **, int)"
                 );
  }
  type = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
  pcVar4 = coda_element_name_from_xml_name(el);
  if (pcVar4 == el) {
LAB_001683c1:
    pcVar4 = *attr;
    if (pcVar4 != (char *)0x0) {
      uVar8 = 0;
      do {
        lVar5 = coda_hashtable_get_index_from_name(definition->real_name_hash_data,pcVar4);
        uVar7 = (uint)lVar5;
        if ((int)uVar7 < 0) {
          table = definition->real_name_hash_data;
          name = coda_element_name_from_xml_name(pcVar4);
          lVar5 = coda_hashtable_get_index_from_name(table,name);
          uVar7 = (uint)lVar5;
          if (-1 < (int)uVar7) {
            pcVar4 = coda_element_name_from_xml_name(pcVar4);
          }
        }
        if (update_definition == 0) {
          if (uVar7 == 0xffffffff) {
            coda_set_error(-300,"xml attribute \'%s\' is not allowed",attr[uVar8]);
            goto LAB_00168607;
          }
          pcVar1 = definition->field[(int)uVar7]->type;
          data = *(uint8_t **)((long)attr + ((uVar8 & 0xffffffff) << 3 | 8));
          length = strlen((char *)data);
          field_type = coda_mem_data_new(pcVar1,(coda_dynamic_type *)0x0,(coda_product *)product,
                                         length,data);
LAB_001684c7:
          iVar3 = 0;
LAB_00168512:
          if (field_type == (coda_mem_data *)0x0) goto LAB_00168607;
          iVar3 = coda_mem_record_add_field(type,pcVar4,(coda_dynamic_type *)field_type,iVar3);
          if (iVar3 != 0) goto LAB_001685ff;
        }
        else {
          if ((int)uVar7 < 0) {
            pcVar6 = coda_type_text_new(coda_format_xml);
            if (pcVar6 != (coda_type_text *)0x0) {
              field_type = coda_mem_string_new(pcVar6,(coda_dynamic_type *)0x0,
                                               (coda_product *)product,
                                               *(char **)((long)attr +
                                                         ((uVar8 & 0xffffffff) << 3 | 8)));
              coda_type_release((coda_type *)pcVar6);
              iVar3 = update_definition;
              goto LAB_00168512;
            }
            goto LAB_00168607;
          }
          if (type->field_type[uVar7] == (coda_dynamic_type *)0x0) {
            field_type = coda_mem_string_new((coda_type_text *)definition->field[uVar7]->type,
                                             (coda_dynamic_type *)0x0,(coda_product *)product,
                                             *(char **)((long)attr + ((uVar8 & 0xffffffff) << 3 | 8)
                                                       ));
            goto LAB_001684c7;
          }
        }
        pcVar4 = attr[uVar8 + 2];
        uVar8 = uVar8 + 2;
      } while (pcVar4 != (char *)0x0);
    }
    lVar5 = definition->num_fields;
    if (0 < lVar5) {
      ppcVar2 = definition->field;
      index = 0;
      do {
        if ((ppcVar2[index]->optional == '\0') &&
           (type->field_type[index] == (coda_dynamic_type *)0x0)) {
          if (update_definition == 0) {
            coda_type_get_record_field_real_name((coda_type *)definition,index,&local_38);
            coda_set_error(-300,"mandatory xml attribute \'%s\' is missing",local_38);
            goto LAB_00168607;
          }
          ppcVar2[index]->optional = '\x01';
        }
        index = index + 1;
      } while (lVar5 != index);
    }
  }
  else {
    lVar5 = coda_hashtable_get_index_from_name(definition->real_name_hash_data,"xmlns");
    uVar7 = (uint)lVar5;
    if (update_definition == 0) {
      if ((int)uVar7 < 0) goto LAB_001683c1;
      pcVar1 = definition->field[uVar7 & 0x7fffffff]->type;
      pcVar4 = coda_element_name_from_xml_name(el);
      field_type = coda_mem_data_new(pcVar1,(coda_dynamic_type *)0x0,(coda_product *)product,
                                     (long)(pcVar4 + ~(ulong)el),(uint8_t *)el);
      if (field_type == (coda_mem_data *)0x0) goto LAB_00168607;
      iVar3 = coda_mem_record_add_field(type,"xmlns",(coda_dynamic_type *)field_type,0);
joined_r0x001683bb:
      if (iVar3 == 0) goto LAB_001683c1;
LAB_001685ff:
      coda_dynamic_type_delete((coda_dynamic_type *)field_type);
    }
    else if ((int)uVar7 < 0) {
      pcVar6 = coda_type_text_new(coda_format_xml);
      if (pcVar6 != (coda_type_text *)0x0) {
        pcVar4 = coda_element_name_from_xml_name(el);
        field_type = coda_mem_data_new((coda_type *)pcVar6,(coda_dynamic_type *)0x0,
                                       (coda_product *)product,(long)(pcVar4 + ~(ulong)el),
                                       (uint8_t *)el);
        coda_type_release((coda_type *)pcVar6);
        iVar3 = update_definition;
        goto LAB_001685d1;
      }
    }
    else {
      if (type->field_type[uVar7 & 0x7fffffff] != (coda_dynamic_type *)0x0) {
        __assert_fail("attributes->field_type[attribute_index] == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x7c,
                      "coda_mem_record *attribute_record_new(coda_type_record *, coda_xml_product *, const char *, const char **, int)"
                     );
      }
      pcVar1 = definition->field[uVar7 & 0x7fffffff]->type;
      pcVar4 = coda_element_name_from_xml_name(el);
      field_type = coda_mem_data_new(pcVar1,(coda_dynamic_type *)0x0,(coda_product *)product,
                                     (long)(pcVar4 + ~(ulong)el),(uint8_t *)el);
      iVar3 = 0;
LAB_001685d1:
      if (field_type != (coda_mem_data *)0x0) {
        iVar3 = coda_mem_record_add_field(type,"xmlns",(coda_dynamic_type *)field_type,iVar3);
        goto joined_r0x001683bb;
      }
    }
LAB_00168607:
    coda_dynamic_type_delete((coda_dynamic_type *)type);
    type = (coda_mem_record *)0x0;
  }
  return type;
}

Assistant:

static coda_mem_record *attribute_record_new(coda_type_record *definition, coda_xml_product *product, const char *el,
                                             const char **attr, int update_definition)
{
    coda_mem_record *attributes;
    coda_mem_data *attribute;
    int update_mem_record = update_definition;
    int attribute_index;
    int i;

    assert(definition != NULL);
    assert(!definition->is_union);
    attributes = coda_mem_record_new(definition, NULL);

    if (el != coda_element_name_from_xml_name(el))
    {
        /* store the namespace part of the full xml name as an 'xmlns' attribute */
        attribute_index = hashtable_get_index_from_name(definition->real_name_hash_data, "xmlns");
        if (update_definition)
        {
            if (attribute_index < 0)
            {
                coda_type_text *attribute_definition;

                attribute_definition = coda_type_text_new(coda_format_xml);
                if (attribute_definition == NULL)
                {
                    coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                    return NULL;
                }
                attribute = coda_mem_data_new((coda_type *)attribute_definition, NULL, (coda_product *)product,
                                              (long)(coda_element_name_from_xml_name(el) - el - 1),
                                              (const uint8_t *)el);
                coda_type_release((coda_type *)attribute_definition);
            }
            else
            {
                assert(attributes->field_type[attribute_index] == NULL);
                attribute = coda_mem_data_new(definition->field[attribute_index]->type, NULL, (coda_product *)product,
                                              (long)(coda_element_name_from_xml_name(el) - el - 1),
                                              (const uint8_t *)el);
                update_mem_record = 0;
            }
            if (attribute == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
            if (coda_mem_record_add_field(attributes, "xmlns", (coda_dynamic_type *)attribute, update_mem_record) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attribute);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
        }
        else if (attribute_index >= 0)
        {
            attribute = coda_mem_data_new(definition->field[attribute_index]->type, NULL, (coda_product *)product,
                                          (long)(coda_element_name_from_xml_name(el) - el - 1), (const uint8_t *)el);
            if (attribute == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
            if (coda_mem_record_add_field(attributes, "xmlns", (coda_dynamic_type *)attribute, update_mem_record) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attribute);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
        }
    }

    /* add attributes to attribute list */
    for (i = 0; attr[2 * i] != NULL; i++)
    {
        const char *real_name = attr[2 * i];

        update_mem_record = update_definition;
        attribute_index = hashtable_get_index_from_name(definition->real_name_hash_data, real_name);
        if (attribute_index < 0)
        {
            attribute_index = hashtable_get_index_from_name(definition->real_name_hash_data,
                                                            coda_element_name_from_xml_name(real_name));
            if (attribute_index >= 0)
            {
                real_name = coda_element_name_from_xml_name(real_name);
            }
        }
        if (update_definition)
        {
            if (attribute_index < 0)
            {
                coda_type_text *attribute_definition;

                attribute_definition = coda_type_text_new(coda_format_xml);
                if (attribute_definition == NULL)
                {
                    coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                    return NULL;
                }
                attribute = coda_mem_string_new(attribute_definition, NULL, (coda_product *)product, attr[2 * i + 1]);
                coda_type_release((coda_type *)attribute_definition);
            }
            else if (attributes->field_type[attribute_index] != NULL)
            {
                /* we only add the first occurrence when there are multiple attributes with the same attribute name */
                continue;
            }
            else
            {
                attribute = coda_mem_string_new((coda_type_text *)definition->field[attribute_index]->type, NULL,
                                                (coda_product *)product, attr[2 * i + 1]);
                update_mem_record = 0;
            }
        }
        else
        {
            if (attribute_index == -1)
            {
                coda_set_error(CODA_ERROR_PRODUCT, "xml attribute '%s' is not allowed", attr[2 * i]);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
            attribute = coda_mem_data_new(definition->field[attribute_index]->type, NULL, (coda_product *)product,
                                          (long)strlen(attr[2 * i + 1]), (uint8_t *)attr[2 * i + 1]);
        }
        if (attribute == NULL)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            return NULL;
        }

        if (coda_mem_record_add_field(attributes, real_name, (coda_dynamic_type *)attribute, update_mem_record) != 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attribute);
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            return NULL;
        }
    }

    for (i = 0; i < definition->num_fields; i++)
    {
        if (!definition->field[i]->optional && attributes->field_type[i] == NULL)
        {
            if (update_definition)
            {
                definition->field[i]->optional = 1;
            }
            else
            {
                const char *real_name;

                coda_type_get_record_field_real_name((coda_type *)definition, i, &real_name);
                coda_set_error(CODA_ERROR_PRODUCT, "mandatory xml attribute '%s' is missing", real_name);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
        }
    }

    return attributes;
}